

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

bool dirichlet_check(int n,double *a)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  ulong uVar5;
  
  if (0 < n) {
    uVar5 = 0;
    bVar1 = false;
    do {
      if (a[uVar5] <= 0.0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," \n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"DIRICHLET_CHECK - Warning!\n",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  A[",4);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)uVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] <= 0.\n",8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  A[",4);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)uVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] = ",4);
        poVar4 = std::ostream::_M_insert<double>(a[uVar5]);
        pcVar3 = ".\n";
        lVar2 = 2;
        goto LAB_00199257;
      }
      if (0.0 < a[uVar5]) {
        bVar1 = true;
      }
      uVar5 = uVar5 + 1;
    } while ((uint)n != uVar5);
    if (bVar1) {
      return true;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," \n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"DIRICHLET_CHECK - Warning!\n",0x1b);
  pcVar3 = "  All parameters are zero!\n";
  lVar2 = 0x1b;
  poVar4 = (ostream *)&std::cerr;
LAB_00199257:
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,lVar2);
  return false;
}

Assistant:

bool dirichlet_check ( int n, double a[] )

//****************************************************************************80
//
//  Purpose:
//
//    DIRICHLET_CHECK checks the parameters of the Dirichlet PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of components.
//
//    Input, double A[N], the probabilities for each component.
//    Each A[I] should be positive.
//
//    Output, bool DIRICHLET_CHECK, is true if the parameters are legal.
//
{
  int i;
  bool positive;

  positive = false;

  for ( i = 0; i < n; i++ )
  {
    if ( a[i] <= 0.0 )
    {
      cerr << " \n";
      cerr << "DIRICHLET_CHECK - Warning!\n";
      cerr << "  A[" << i << "] <= 0.\n";
      cerr << "  A[" << i << "] = " << a[i] << ".\n";
      return false;
    }
    else if ( 0.0 < a[i] )
    {
      positive = true;
    }
  }

  if ( !positive )
  {
    cerr << " \n";
    cerr << "DIRICHLET_CHECK - Warning!\n";
    cerr << "  All parameters are zero!\n";
    return false;
  }

  return true;
}